

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

int Abc_AigSetChoiceLevels(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_20;
  int LevelCur;
  int LevelMax;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                  ,0x707,"int Abc_AigSetChoiceLevels(Abc_Ntk_t *)");
  }
  Abc_NtkIncrementTravId(pNtk);
  for (LevelCur = 0; iVar1 = Abc_NtkCiNum(pNtk), LevelCur < iVar1; LevelCur = LevelCur + 1) {
    pAVar2 = Abc_NtkCi(pNtk,LevelCur);
    Abc_NodeSetTravIdCurrent(pAVar2);
    (pAVar2->field_6).pTemp = (void *)0x0;
  }
  pAVar2 = Abc_AigConst1(pNtk);
  Abc_NodeSetTravIdCurrent(pAVar2);
  (pAVar2->field_6).pTemp = (void *)0x0;
  local_20 = 0;
  for (LevelCur = 0; iVar1 = Abc_NtkCoNum(pNtk), LevelCur < iVar1; LevelCur = LevelCur + 1) {
    pAVar2 = Abc_NtkCo(pNtk,LevelCur);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    iVar1 = Abc_NodeSetChoiceLevel_rec(pAVar2,1);
    local_20 = Abc_MaxInt(local_20,iVar1);
  }
  return local_20;
}

Assistant:

int Abc_AigSetChoiceLevels( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i, LevelMax, LevelCur;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the new travid counter
    Abc_NtkIncrementTravId( pNtk );
    // set levels of the CI and constant
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj->pCopy = NULL;
    }
    pObj = Abc_AigConst1( pNtk );
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->pCopy = NULL;
    // set levels of all other nodes
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        LevelCur = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pObj), 1 );
        LevelMax = Abc_MaxInt( LevelMax, LevelCur );
    }
    return LevelMax;
}